

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void units::removeUserDefinedUnit(string *name)

{
  __type _Var1;
  unit uVar2;
  long *plVar3;
  unit *puVar4;
  unit unit;
  unit local_38;
  string local_30;
  
  puVar4 = &local_38;
  std::__cxx11::string::string((string *)&local_30,(string *)name);
  uVar2 = unit_cast_from_string(&local_30,defaultMatchFlags);
  local_38 = uVar2;
  std::__cxx11::string::~string((string *)&local_30);
  if (uVar2.base_units_ == (unit_data)0xfa94a488 && NAN(uVar2.multiplier_)) {
    plVar3 = (long *)(user_defined_unit_names_abi_cxx11_ + 0x10);
    do {
      plVar3 = (long *)*plVar3;
      if (plVar3 == (long *)0x0) {
        return;
      }
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (plVar3 + 2),name);
    } while (!_Var1);
    puVar4 = (unit *)(plVar3 + 1);
  }
  else {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)user_defined_units_abi_cxx11_,name);
  }
  std::
  _Hashtable<units::unit,_std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<units::unit>,_std::hash<units::unit>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase((_Hashtable<units::unit,_std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<units::unit>,_std::hash<units::unit>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)user_defined_unit_names_abi_cxx11_,puVar4);
  return;
}

Assistant:

void removeUserDefinedUnit(const std::string& name)
{
    // get the currently converted unit
    auto unit = unit_cast_from_string(name);
    if (is_valid(unit)) {
        user_defined_units.erase(name);
        user_defined_unit_names.erase(unit);
    } else {
        for (const auto& udun : user_defined_unit_names) {
            if (udun.second == name) {
                user_defined_unit_names.erase(udun.first);
                break;
            }
        }
    }
}